

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Destroy<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
          (RepeatedPtrFieldBase *this)

{
  int *key;
  RepeatedPtrFieldBase *this_00;
  iterator iVar1;
  
  key = (int *)this->tagged_rep_or_elem_;
  if (key != (int *)0x0) {
    Destroy<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>();
    return;
  }
  this_00 = (RepeatedPtrFieldBase *)&stack0xfffffffffffffff0;
  Destroy<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>(this_00);
  iVar1 = absl::lts_20240722::container_internal::
          btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
          ::internal_find<int>
                    ((btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                      *)this_00,key);
  if (iVar1.node_ ==
      (btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
       *)0x0) {
    absl::lts_20240722::container_internal::
    btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
    ::end((btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
           *)this_00);
  }
  return;
}

Assistant:

void Destroy() {
    ABSL_DCHECK(NeedsDestroy());

    // TODO: arena check is redundant once all `RepeatedPtrField`s
    // with non-null arena are owned by the arena.
    if (PROTOBUF_PREDICT_FALSE(arena_ != nullptr)) return;

    using H = CommonHandler<TypeHandler>;
    int n = allocated_size();
    void** elems = elements();
    for (int i = 0; i < n; i++) {
      Delete<H>(elems[i], nullptr);
    }
    if (!using_sso()) {
      internal::SizedDelete(rep(),
                            Capacity() * sizeof(elems[0]) + kRepHeaderSize);
    }
  }